

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O0

int rops_issue_keepalive_h2(lws *wsi,int isvalid)

{
  lws *wsi_00;
  anon_struct_8_2_43e7303c_for_rs aVar1;
  lws_h2_protocol_send *pps_00;
  uint64_t us;
  lws_h2_protocol_send *pps;
  lws *nwsi;
  int isvalid_local;
  lws *wsi_local;
  
  wsi_00 = lws_get_network_wsi(wsi);
  aVar1 = (anon_struct_8_2_43e7303c_for_rs)lws_now_usecs();
  if (isvalid == 0) {
    if (wsi != wsi_00) {
      __assert_fail("wsi == nwsi",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/ops-h2.c"
                    ,0x4b5,"int rops_issue_keepalive_h2(struct lws *, int)");
    }
    pps_00 = lws_h2_new_pps(LWS_H2_PPS_PING);
    if (pps_00 == (lws_h2_protocol_send *)0x0) {
      wsi_local._4_4_ = 1;
    }
    else {
      (pps_00->u).rs = aVar1;
      lws_pps_schedule(wsi_00,pps_00);
      wsi_local._4_4_ = 0;
    }
  }
  else {
    _lws_validity_confirmed_role(wsi_00);
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_issue_keepalive_h2(struct lws *wsi, int isvalid)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	struct lws_h2_protocol_send *pps;
	uint64_t us = lws_now_usecs();

	if (isvalid) {
		_lws_validity_confirmed_role(nwsi);

		return 0;
	}

	/*
	 * We can only send these frames on the network connection itself...
	 * we shouldn't be tracking validity on anything else
	 */

	assert(wsi == nwsi);

	pps = lws_h2_new_pps(LWS_H2_PPS_PING);
	if (!pps)
		return 1;

	/*
	 * The peer is defined to copy us back the unchanged payload in another
	 * PING frame this time with ACK set.  So by sending that out with the
	 * current time, it's an interesting opportunity to learn the effective
	 * RTT on the link when the PONG comes in, plus or minus the time to
	 * schedule the PPS.
	 */

	memcpy(pps->u.ping.ping_payload, &us, 8);
	lws_pps_schedule(nwsi, pps);

	return 0;
}